

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O0

void __thiscall QToolBoxPrivate::relayout(QToolBoxPrivate *this)

{
  bool bVar1;
  QVBoxLayout *pQVar2;
  pointer pPVar3;
  QToolBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *page;
  PageList *__range1;
  QToolBox *q;
  iterator __end1;
  iterator __begin1;
  QWidget *in_stack_ffffffffffffff68;
  QMargins *in_stack_ffffffffffffff70;
  QMargins *in_stack_ffffffffffffff78;
  QFlagsStorage<Qt::AlignmentFlag> alignment;
  QLayout *in_stack_ffffffffffffff80;
  undefined1 local_30 [4];
  undefined1 local_2c [4];
  unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *local_28;
  __normal_iterator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_*,_std::vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>_>
  local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  if (in_RDI->layout != (QVBoxLayout *)0x0) {
    (**(code **)(*(long *)&(in_RDI->layout->super_QBoxLayout).super_QLayout + 0x20))();
  }
  pQVar2 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout((QVBoxLayout *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  in_RDI->layout = pQVar2;
  QMargins::QMargins(in_stack_ffffffffffffff70);
  QLayout::setContentsMargins(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  local_20[0]._M_current =
       (unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *)
       &DAT_aaaaaaaaaaaaaaaa;
  local_20[0]._M_current =
       (unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *)
       std::
       vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
       ::begin((vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
                *)in_stack_ffffffffffffff70);
  local_28 = (unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *)
             &DAT_aaaaaaaaaaaaaaaa;
  local_28 = (unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *)
             std::
             vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
             ::end((vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
                    *)in_stack_ffffffffffffff70);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_*,_std::vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>_>
                        *)in_stack_ffffffffffffff70,
                       (__normal_iterator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_*,_std::vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_*,_std::vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>_>
    ::operator*(local_20);
    in_stack_ffffffffffffff70 = (QMargins *)in_RDI->layout;
    pPVar3 = std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>::
             operator->((unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>
                         *)0x70373b);
    alignment.i = (Int)((ulong)pPVar3->button >> 0x20);
    memset(local_2c,0,4);
    QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x70375e);
    QBoxLayout::addWidget
              ((QBoxLayout *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0,
               (Alignment)alignment.i);
    std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>::operator->
              ((unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *)
               0x70378e);
    memset(local_30,0,4);
    QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x7037b2);
    QBoxLayout::addWidget
              ((QBoxLayout *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0,
               (Alignment)alignment.i);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_*,_std::vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>_>
    ::operator++(local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBoxPrivate::relayout()
{
    Q_Q(QToolBox);
    delete layout;
    layout = new QVBoxLayout(q);
    layout->setContentsMargins(QMargins());
    for (const auto &page : pageList) {
        layout->addWidget(page->button);
        layout->addWidget(page->sv);
    }
}